

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O3

DdNode * cuddBddComposeRecur(DdManager *dd,DdNode *f,DdNode *g,DdNode *proj)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  DdNode *g_00;
  DdNode *f_00;
  DdNode *local_48;
  
  uVar7 = dd->perm[proj->index];
  f_00 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
  uVar6 = 0x7fffffff;
  if ((ulong)f_00->index != 0x7fffffff) {
    uVar6 = dd->perm[f_00->index];
  }
  if (uVar7 < uVar6) {
    return f;
  }
  pDVar2 = cuddCacheLookup(dd,0x2e,f_00,g,proj);
  if (pDVar2 != (DdNode *)0x0) {
    return (DdNode *)((ulong)((uint)f & 1) ^ (ulong)pDVar2);
  }
  if (uVar6 == uVar7) {
    pDVar3 = cuddBddIteRecur(dd,g,(f_00->type).kids.T,(f_00->type).kids.E);
    if (pDVar3 != (DdNode *)0x0) {
LAB_00808429:
      cuddCacheInsert(dd,0x2e,f_00,g,proj,pDVar3);
      return (DdNode *)((ulong)((uint)f & 1) ^ (ulong)pDVar3);
    }
  }
  else {
    pDVar2 = (DdNode *)((ulong)g & 0xfffffffffffffffe);
    uVar5 = (ulong)pDVar2->index;
    uVar7 = 0x7fffffff;
    if (uVar5 != 0x7fffffff) {
      uVar7 = dd->perm[uVar5];
    }
    pDVar4 = f_00;
    local_48 = f_00;
    if (uVar6 <= uVar7) {
      uVar5 = (ulong)f_00->index;
      pDVar4 = (f_00->type).kids.T;
      local_48 = (f_00->type).kids.E;
    }
    pDVar3 = g;
    g_00 = g;
    if (uVar7 <= uVar6) {
      pDVar3 = (pDVar2->type).kids.T;
      g_00 = (pDVar2->type).kids.E;
      if (pDVar2 != g) {
        pDVar3 = (DdNode *)((ulong)pDVar3 ^ 1);
        g_00 = (DdNode *)((ulong)g_00 ^ 1);
      }
    }
    pDVar2 = cuddBddComposeRecur(dd,pDVar4,pDVar3,proj);
    if (pDVar2 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar4 = cuddBddComposeRecur(dd,local_48,g_00,proj);
      if (pDVar4 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar3 = cuddBddIteRecur(dd,dd->vars[uVar5],pDVar2,pDVar4);
        if (pDVar3 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_IterDerefBdd(dd,pDVar2);
          Cudd_IterDerefBdd(dd,pDVar4);
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          goto LAB_00808429;
        }
        Cudd_IterDerefBdd(dd,pDVar2);
        pDVar2 = pDVar4;
      }
      Cudd_IterDerefBdd(dd,pDVar2);
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddBddComposeRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode * proj)
{
    DdNode      *F, *G, *f1, *f0, *g1, *g0, *r, *t, *e;
    unsigned int v, topf, topg, topindex;
    int         comple;

    statLine(dd);
    v = dd->perm[proj->index];
    F = Cudd_Regular(f);
    topf = cuddI(dd,F->index);

    /* Terminal case. Subsumes the test for constant f. */
    if (topf > v) return(f);

    /* We solve the problem for a regular pointer, and then complement
    ** the result if the pointer was originally complemented.
    */
    comple = Cudd_IsComplement(f);

    /* Check cache. */
    r = cuddCacheLookup(dd,DD_BDD_COMPOSE_RECUR_TAG,F,g,proj);
    if (r != NULL) {
        return(Cudd_NotCond(r,comple));
    }

    if (topf == v) {
        /* Compose. */
        f1 = cuddT(F);
        f0 = cuddE(F);
        r = cuddBddIteRecur(dd, g, f1, f0);
        if (r == NULL) return(NULL);
    } else {
        /* Compute cofactors of f and g. Remember the index of the top
        ** variable.
        */
        G = Cudd_Regular(g);
        topg = cuddI(dd,G->index);
        if (topf > topg) {
            topindex = G->index;
            f1 = f0 = F;
        } else {
            topindex = F->index;
            f1 = cuddT(F);
            f0 = cuddE(F);
        }
        if (topg > topf) {
            g1 = g0 = g;
        } else {
            g1 = cuddT(G);
            g0 = cuddE(G);
            if (g != G) {
                g1 = Cudd_Not(g1);
                g0 = Cudd_Not(g0);
            }
        }
        /* Recursive step. */
        t = cuddBddComposeRecur(dd, f1, g1, proj);
        if (t == NULL) return(NULL);
        cuddRef(t);
        e = cuddBddComposeRecur(dd, f0, g0, proj);
        if (e == NULL) {
            Cudd_IterDerefBdd(dd, t);
            return(NULL);
        }
        cuddRef(e);

        r = cuddBddIteRecur(dd, dd->vars[topindex], t, e);
        if (r == NULL) {
            Cudd_IterDerefBdd(dd, t);
            Cudd_IterDerefBdd(dd, e);
            return(NULL);
        }
        cuddRef(r);
        Cudd_IterDerefBdd(dd, t); /* t & e not necessarily part of r */
        Cudd_IterDerefBdd(dd, e);
        cuddDeref(r);
    }

    cuddCacheInsert(dd,DD_BDD_COMPOSE_RECUR_TAG,F,g,proj,r);

    return(Cudd_NotCond(r,comple));

}